

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_image.cxx
# Opt level: O0

void mono8_converter(uchar *from,uchar *to,int w,int delta)

{
  Fl_Color i_00;
  Fl_XColor *xmap;
  Fl_Color i;
  int td;
  int d;
  int b;
  int g;
  int r;
  int delta_local;
  int w_local;
  uchar *to_local;
  uchar *from_local;
  
  b = ri;
  d = gi;
  td = bi;
  if (dir == 0) {
    xmap._4_4_ = 1;
    i = delta;
    _delta_local = to;
    to_local = from;
  }
  else {
    to_local = from + (w + -1) * delta;
    _delta_local = to + (w + -1);
    i = -delta;
    xmap._4_4_ = -1;
  }
  dir = (int)(dir == 0);
  r = w;
  while (r != 0) {
    b = (uint)*to_local + b;
    if (b < 0) {
      b = 0;
    }
    else if (0xff < b) {
      b = 0xff;
    }
    d = (uint)*to_local + d;
    if (d < 0) {
      d = 0;
    }
    else if (0xff < d) {
      d = 0xff;
    }
    td = (uint)*to_local + td;
    if (td < 0) {
      td = 0;
    }
    else if (0xff < td) {
      td = 0xff;
    }
    i_00 = fl_color_cube((b * 5) / 0x100,(d << 3) / 0x100,(td * 5) / 0x100);
    if (fl_xmap[0][i_00].mapped == '\0') {
      if (fl_redmask == '\0') {
        fl_xpixel((uchar)b,(uchar)d,(uchar)td);
      }
      else {
        fl_xpixel(i_00);
      }
    }
    b = b - (uint)fl_xmap[0][i_00].r;
    d = d - (uint)fl_xmap[0][i_00].g;
    td = td - (uint)fl_xmap[0][i_00].b;
    *_delta_local = (uchar)fl_xmap[0][i_00].pixel;
    to_local = to_local + (int)i;
    _delta_local = _delta_local + xmap._4_4_;
    r = r + -1;
  }
  ri = b;
  gi = d;
  bi = td;
  return;
}

Assistant:

static void mono8_converter(const uchar *from, uchar *to, int w, int delta) {
  int r=ri, g=gi, b=bi;
  int d, td;
  if (dir) {
    dir = 0;
    from = from+(w-1)*delta;
    to = to+(w-1);
    d = -delta;
    td = -1;
  } else {
    dir = 1;
    d = delta;
    td = 1;
  }
  for (; w--; from += d, to += td) {
    r += from[0]; if (r < 0) r = 0; else if (r>255) r = 255;
    g += from[0]; if (g < 0) g = 0; else if (g>255) g = 255;
    b += from[0]; if (b < 0) b = 0; else if (b>255) b = 255;
    Fl_Color i = fl_color_cube(r*FL_NUM_RED/256,g*FL_NUM_GREEN/256,b*FL_NUM_BLUE/256);
    Fl_XColor& xmap = fl_xmap[0][i];
    if (!xmap.mapped) {if (!fl_redmask) fl_xpixel(r,g,b); else fl_xpixel(i);}
    r -= xmap.r;
    g -= xmap.g;
    b -= xmap.b;
    *to = uchar(xmap.pixel);
  }
  ri = r; gi = g; bi = b;
}